

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::replaceData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count,XMLCh *dat)

{
  bool bVar1;
  DOMNodeImpl *this_00;
  DOMException *this_01;
  MemoryManager *local_60;
  XMLCh *dat_local;
  XMLSize_t count_local;
  XMLSize_t offset_local;
  DOMNode *node_local;
  DOMCharacterDataImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(node);
  bVar1 = DOMNodeImpl::isReadOnly(this_00);
  if (!bVar1) {
    deleteData(this,node,offset,count);
    insertData(this,node,offset,dat);
    return;
  }
  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDoc == (DOMDocumentImpl *)0x0) {
    local_60 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    local_60 = DOMDocumentImpl::getMemoryManager(this->fDoc);
  }
  DOMException::DOMException(this_01,7,0,local_60);
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::replaceData(const DOMNode *node, XMLSize_t offset, XMLSize_t count,
                                    const XMLCh *dat)
{
    if (castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    deleteData(node, offset, count);
    insertData(node, offset, dat);
}